

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

picnic_params_t_conflict argument_to_params(char *arg)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *extraout_RAX;
  ulong unaff_RBX;
  long lVar7;
  long lVar8;
  bool bVar9;
  uint idx;
  string sarg;
  istringstream iss;
  uint local_1f0;
  uint local_1ec;
  ulong local_1e8;
  ulong local_1e0;
  char *local_1d8;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  char *local_1b0;
  long local_1a8;
  char local_1a0 [16];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)&local_1d0,arg,(allocator *)&local_1b0);
  local_1e8 = 0;
  lVar8 = 0;
  do {
    uVar2 = *(uint *)((long)&(anonymous_namespace)::all_parameters + lVar8);
    pcVar6 = (char *)picnic_get_param_name(uVar2);
    std::__cxx11::string::string((string *)&local_1b0,pcVar6,(allocator *)&local_1f0);
    pcVar6 = local_1b0;
    lVar3 = local_1c8;
    local_1ec = uVar2;
    local_1e0 = unaff_RBX;
    if (local_1c8 == local_1a8) {
      bVar9 = local_1c8 == 0;
      if (!bVar9) {
        local_1d8 = local_1d0;
        cVar1 = *local_1b0;
        iVar4 = tolower((int)*local_1d0);
        iVar5 = tolower((int)cVar1);
        if (iVar4 == iVar5) {
          lVar7 = 1;
          do {
            bVar9 = lVar3 == lVar7;
            if (bVar9) goto LAB_0010386d;
            cVar1 = pcVar6[lVar7];
            iVar4 = tolower((int)local_1d8[lVar7]);
            iVar5 = tolower((int)cVar1);
            lVar7 = lVar7 + 1;
          } while (iVar4 == iVar5);
        }
        goto LAB_0010386a;
      }
    }
    else {
LAB_0010386a:
      bVar9 = false;
    }
LAB_0010386d:
    unaff_RBX = local_1e0 & 0xffffffff;
    if (bVar9) {
      unaff_RBX = (ulong)local_1ec;
    }
    pcVar6 = local_1a0;
    if (local_1b0 != pcVar6) {
      operator_delete(local_1b0);
      pcVar6 = extraout_RAX;
    }
    if (bVar9) break;
    lVar8 = lVar8 + 4;
    local_1e8 = CONCAT71((int7)((ulong)pcVar6 >> 8),lVar8 == 0x30);
  } while (lVar8 != 0x30);
  if ((local_1e8 & 1) != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1b0,(string *)&local_1d0,_S_in);
    std::istream::_M_extract<unsigned_int>((uint *)&local_1b0);
    unaff_RBX = (ulong)local_1f0;
    if (local_1f0 - 0xd < 0xfffffff4) {
      unaff_RBX = 0;
    }
    if ((abStack_190[*(long *)(local_1b0 + -0x18)] & 5) != 0) {
      unaff_RBX = 0;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  return (picnic_params_t_conflict)unaff_RBX;
}

Assistant:

picnic_params_t argument_to_params(const char* arg) {
  const std::string sarg{arg};

  for (const auto param : all_parameters) {
    const std::string name{picnic_get_param_name(param)};
    if (isequal(sarg, name)) {
      return param;
    }
  }

  std::istringstream iss{sarg};
  unsigned int idx;
  iss >> idx;
  if (!iss || idx == PARAMETER_SET_INVALID || idx >= PARAMETER_SET_MAX_INDEX) {
    return PARAMETER_SET_INVALID;
  }

  return static_cast<picnic_params_t>(idx);
}